

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

ssize_t __thiscall
duckdb_parquet::SizeStatistics::read(SizeStatistics *this,int __fd,void *__buf,size_t __nbytes)

{
  pointer plVar1;
  SizeStatistics *pSVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  reference pvVar6;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  size_type sVar7;
  uint32_t _size0;
  int16_t fid;
  TType _etype3;
  TType ftype;
  string fname;
  uint local_74;
  SizeStatistics *local_70;
  short local_62;
  undefined1 local_60 [4];
  int local_5c;
  int64_t *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_00);
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  iVar3 = (*this_00->_vptr_TProtocol[0x19])(this_00,&local_50);
  local_58 = &this->unencoded_byte_array_data_bytes;
  local_70 = this;
  do {
    iVar4 = (*this_00->_vptr_TProtocol[0x1b])(this_00,&local_50,&local_5c,&local_62);
    iVar4 = iVar4 + iVar3;
    if (local_5c == 0) {
      iVar3 = (*this_00->_vptr_TProtocol[0x1a])(this_00);
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      this_00->input_recursion_depth_ = this_00->input_recursion_depth_ - 1;
      return (ulong)(uint)(iVar3 + iVar4);
    }
    if (local_62 == 3) {
      if (local_5c != 0xf) {
        iVar5 = (*this_00->_vptr_TProtocol[0x2c])(this_00);
        goto LAB_002c1b62;
      }
      plVar1 = (local_70->definition_level_histogram).super_vector<long,_std::allocator<long>_>.
               super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if ((local_70->definition_level_histogram).super_vector<long,_std::allocator<long>_>.
          super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
          != plVar1) {
        (local_70->definition_level_histogram).super_vector<long,_std::allocator<long>_>.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
             plVar1;
      }
      iVar3 = (*this_00->_vptr_TProtocol[0x1f])(this_00,local_60,&local_74);
      std::vector<long,_std::allocator<long>_>::resize
                (&(this->definition_level_histogram).super_vector<long,_std::allocator<long>_>,
                 (ulong)local_74);
      pSVar2 = local_70;
      iVar3 = iVar3 + iVar4;
      if (local_74 != 0) {
        sVar7 = 0;
        do {
          pvVar6 = duckdb::vector<long,_true>::operator[](&this->definition_level_histogram,sVar7);
          iVar4 = (*this_00->_vptr_TProtocol[0x28])(this_00,pvVar6);
          iVar3 = iVar3 + iVar4;
          sVar7 = sVar7 + 1;
        } while (sVar7 < local_74);
      }
      iVar5 = (*this_00->_vptr_TProtocol[0x20])(this_00);
      iVar5 = iVar5 + iVar3;
      pSVar2->__isset = (_SizeStatistics__isset)((byte)pSVar2->__isset | 4);
    }
    else {
      if (local_62 == 2) {
        if (local_5c == 0xf) {
          plVar1 = (local_70->repetition_level_histogram).super_vector<long,_std::allocator<long>_>.
                   super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          if ((local_70->repetition_level_histogram).super_vector<long,_std::allocator<long>_>.
              super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
              _M_finish != plVar1) {
            (local_70->repetition_level_histogram).super_vector<long,_std::allocator<long>_>.
            super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
            _M_finish = plVar1;
          }
          iVar3 = (*this_00->_vptr_TProtocol[0x1f])(this_00,local_60,&local_74);
          std::vector<long,_std::allocator<long>_>::resize
                    (&(this->repetition_level_histogram).super_vector<long,_std::allocator<long>_>,
                     (ulong)local_74);
          pSVar2 = local_70;
          iVar3 = iVar3 + iVar4;
          if (local_74 != 0) {
            sVar7 = 0;
            do {
              pvVar6 = duckdb::vector<long,_true>::operator[]
                                 (&this->repetition_level_histogram,sVar7);
              iVar4 = (*this_00->_vptr_TProtocol[0x28])(this_00,pvVar6);
              iVar3 = iVar3 + iVar4;
              sVar7 = sVar7 + 1;
            } while (sVar7 < local_74);
          }
          iVar5 = (*this_00->_vptr_TProtocol[0x20])(this_00);
          iVar5 = iVar5 + iVar3;
          pSVar2->__isset = (_SizeStatistics__isset)((byte)pSVar2->__isset | 2);
          goto LAB_002c1b68;
        }
        iVar5 = (*this_00->_vptr_TProtocol[0x2c])(this_00);
      }
      else if (local_62 == 1) {
        if (local_5c == 10) {
          iVar5 = (*this_00->_vptr_TProtocol[0x28])(this_00,local_58);
          iVar5 = iVar5 + iVar4;
          local_70->__isset = (_SizeStatistics__isset)((byte)local_70->__isset | 1);
          goto LAB_002c1b68;
        }
        iVar5 = (*this_00->_vptr_TProtocol[0x2c])(this_00);
      }
      else {
        iVar5 = (*this_00->_vptr_TProtocol[0x2c])(this_00);
      }
LAB_002c1b62:
      iVar5 = iVar5 + iVar4;
    }
LAB_002c1b68:
    iVar3 = (*this_00->_vptr_TProtocol[0x1c])(this_00);
    iVar3 = iVar3 + iVar5;
  } while( true );
}

Assistant:

uint32_t SizeStatistics::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;


  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->unencoded_byte_array_data_bytes);
          this->__isset.unencoded_byte_array_data_bytes = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->repetition_level_histogram.clear();
            uint32_t _size0;
            ::apache::thrift::protocol::TType _etype3;
            xfer += iprot->readListBegin(_etype3, _size0);
            this->repetition_level_histogram.resize(_size0);
            uint32_t _i4;
            for (_i4 = 0; _i4 < _size0; ++_i4)
            {
              xfer += iprot->readI64(this->repetition_level_histogram[_i4]);
            }
            xfer += iprot->readListEnd();
          }
          this->__isset.repetition_level_histogram = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->definition_level_histogram.clear();
            uint32_t _size5;
            ::apache::thrift::protocol::TType _etype8;
            xfer += iprot->readListBegin(_etype8, _size5);
            this->definition_level_histogram.resize(_size5);
            uint32_t _i9;
            for (_i9 = 0; _i9 < _size5; ++_i9)
            {
              xfer += iprot->readI64(this->definition_level_histogram[_i9]);
            }
            xfer += iprot->readListEnd();
          }
          this->__isset.definition_level_histogram = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  return xfer;
}